

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool Internal_WriteFacePtrList
               (unsigned_short face_count,size_t faceN_capacity,ON_SubDFacePtr *faceN,
               unsigned_short faceX_capacity,ON_SubDFacePtr *faceX,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_SubDComponentBase *this;
  uint local_54;
  ON_SubDFace *face;
  ON_SubDFacePtr *pOStack_40;
  unsigned_short i;
  ON_SubDFacePtr *fptr;
  ON_BinaryArchive *archive_local;
  ON_SubDFacePtr *faceX_local;
  unsigned_short faceX_capacity_local;
  ON_SubDFacePtr *faceN_local;
  size_t faceN_capacity_local;
  unsigned_short face_count_local;
  
  faceN_capacity_local._4_2_ = face_count;
  ON_SubDArchiveIdMap::ValidateArrayCounts
            ((unsigned_short *)((long)&faceN_capacity_local + 4),faceN_capacity,faceN,faceX_capacity
             ,faceX);
  bVar1 = ON_BinaryArchive::WriteShort(archive,faceN_capacity_local._4_2_);
  if (bVar1) {
    if (faceN_capacity_local._4_2_ == 0) {
      return true;
    }
    pOStack_40 = faceN;
    for (face._6_2_ = 0; face._6_2_ < faceN_capacity_local._4_2_; face._6_2_ = face._6_2_ + 1) {
      if (face._6_2_ == faceN_capacity) {
        pOStack_40 = faceX;
      }
      this = (ON_SubDComponentBase *)(pOStack_40->m_ptr & 0xfffffffffffffff8);
      if (this == (ON_SubDComponentBase *)0x0) {
        local_54 = 0;
      }
      else {
        local_54 = ON_SubDComponentBase::ArchiveId(this);
      }
      bVar1 = Internal_WriteArchiveIdAndFlags(local_54,pOStack_40->m_ptr,archive);
      if (!bVar1) break;
      pOStack_40 = pOStack_40 + 1;
    }
    if (faceN_capacity_local._4_2_ <= face._6_2_) {
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_WriteFacePtrList(
  unsigned short face_count,
  size_t faceN_capacity,
  const ON_SubDFacePtr* faceN,
  unsigned short faceX_capacity,
  const ON_SubDFacePtr* faceX,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    ON_SubDArchiveIdMap::ValidateArrayCounts(face_count,faceN_capacity,faceN,faceX_capacity,faceX);

    if (!archive.WriteShort(face_count))
      break;

    if ( 0 == face_count )
      return true;

    const ON_SubDFacePtr* fptr = faceN;
    unsigned short i = 0;
    for (i = 0; i < face_count; i++, fptr++)
    {
      if ( i == faceN_capacity)
        fptr = faceX;
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(fptr->m_ptr);
      if (!Internal_WriteArchiveIdAndFlags((nullptr != face) ? face->ArchiveId() : 0,fptr->m_ptr,archive))
        break;
    }
    if ( i < face_count )
      break;

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}